

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

_Bool os_direxists(char *filepath)

{
  int iVar1;
  int *piVar2;
  undefined1 local_b0 [4];
  int stres;
  stat st;
  _Bool result;
  char *filepath_local;
  
  st.__glibc_reserved[2]._7_1_ = 0;
  iVar1 = stat(filepath,(stat *)local_b0);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xd) {
        piVar2 = __errno_location();
        if (*piVar2 != 0x14) {
          perror("fexists failure");
          exit(1);
        }
      }
    }
    filepath_local._7_1_ = false;
  }
  else if (((uint)st.st_nlink & 0xf000) == 0x4000) {
    filepath_local._7_1_ = true;
  }
  else {
    filepath_local._7_1_ = false;
  }
  return filepath_local._7_1_;
}

Assistant:

bool os_direxists(char *filepath) {
    bool result = false;
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    struct stat st;
    int stres = stat(filepath, &st);

    if (stres == -1) {
        if (errno == ENOENT || errno == EACCES || errno == ENOTDIR) {
            return false;
        }
        perror("fexists failure");
        exit(EXIT_FAILURE);
    } else {
        if (S_ISDIR(st.st_mode)) {
            return true;
        } else {
            return false;
        }
    }
#elif __APPLE__
#error "TODO os_fexists for APPLE platform"
#else
#error "TODO os_fexists for WINDOWS platform"
#endif

    return result;
}